

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSExporter::WriteMeshes(Discreet3DSExporter *this)

{
  uint uVar1;
  aiNode *paVar2;
  aiMesh *this_00;
  aiFace *paVar3;
  float f_00;
  bool bVar4;
  reference ppVar5;
  mapped_type *this_01;
  float *pfVar6;
  aiNode *in_R8;
  aiVector3t<float> aVar7;
  uint local_160;
  uint local_15c;
  uint c;
  uint r;
  ChunkWriter chunk_4;
  uint j;
  aiFace *f_1;
  uint i_3;
  aiFace *f;
  uint i_2;
  uint16_t count_2;
  ChunkWriter chunk_3;
  aiVector3D *v_1;
  uint i_1;
  uint16_t count_1;
  ChunkWriter chunk_2;
  size_t local_e0;
  float local_d8;
  size_t *local_d0;
  aiVector3D *v;
  uint i;
  uint16_t count;
  ChunkWriter chunk_1;
  ChunkWriter chunk2;
  string local_90;
  string *local_70;
  string *name;
  ChunkWriter chunk;
  aiMatrix4x4 *trafo;
  aiMesh *mesh;
  uint mesh_idx;
  aiNode *node;
  _Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_> local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_> local_18;
  const_iterator it;
  Discreet3DSExporter *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
       ::begin(&this->meshes);
  std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::
  _Rb_tree_const_iterator(&local_18,&local_20);
  while( true ) {
    node = (aiNode *)
           std::
           multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
           ::end(&this->meshes);
    std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_28,(iterator *)&node);
    bVar4 = std::operator!=(&local_18,&local_28);
    if (!bVar4) break;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator*
                       (&local_18);
    paVar2 = ppVar5->first;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator*
                       (&local_18);
    uVar1 = ppVar5->second;
    this_00 = this->scene->mMeshes[uVar1];
    chunk.chunk_start_pos = (size_t)paVar2;
    this_01 = std::
              map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
              ::operator[](&this->trafos,(key_type *)&chunk.chunk_start_pos);
    anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&name,&this->writer,0x4000);
    (anonymous_namespace)::GetMeshName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)this_00,(aiMesh *)(ulong)uVar1,(uint)paVar2,in_R8)
    ;
    local_70 = &local_90;
    WriteString(this,local_70);
    anon_unknown_0::ChunkWriter::ChunkWriter
              ((ChunkWriter *)&chunk_1.chunk_start_pos,&this->writer,0x4100);
    anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&i,&this->writer,0x4110);
    v._6_2_ = (uint16_t)this_00->mNumVertices;
    StreamWriter<false,_false>::PutU2(&this->writer,v._6_2_);
    for (v._0_4_ = 0; (uint)v < this_00->mNumVertices; v._0_4_ = (uint)v + 1) {
      aVar7 = ::operator*(this_01,this_00->mVertices + (uint)v);
      local_d8 = aVar7.z;
      chunk_2.chunk_start_pos = aVar7._0_8_;
      local_d0 = &local_e0;
      local_e0._0_4_ = aVar7.x;
      f_00 = (float)local_e0;
      local_e0 = chunk_2.chunk_start_pos;
      StreamWriter<false,_false>::PutF4(&this->writer,f_00);
      StreamWriter<false,_false>::PutF4(&this->writer,*(float *)((long)local_d0 + 4));
      StreamWriter<false,_false>::PutF4(&this->writer,*(float *)(local_d0 + 1));
    }
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&i);
    bVar4 = aiMesh::HasTextureCoords(this_00,0);
    if (bVar4) {
      anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&i_1,&this->writer,0x4140);
      StreamWriter<false,_false>::PutU2(&this->writer,(uint16_t)this_00->mNumVertices);
      for (v_1._0_4_ = 0; (uint)v_1 < this_00->mNumVertices; v_1._0_4_ = (uint)v_1 + 1) {
        chunk_3.chunk_start_pos = (size_t)(this_00->mTextureCoords[0] + (uint)v_1);
        StreamWriter<false,_false>::PutF4(&this->writer,((aiVector3D *)chunk_3.chunk_start_pos)->x);
        StreamWriter<false,_false>::PutF4(&this->writer,*(float *)(chunk_3.chunk_start_pos + 4));
      }
      anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&i_1);
    }
    anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&i_2,&this->writer,0x4120);
    f._6_2_ = 0;
    for (f._0_4_ = 0; (uint)f < this_00->mNumFaces; f._0_4_ = (uint)f + 1) {
      if (2 < this_00->mFaces[(uint)f].mNumIndices) {
        f._6_2_ = f._6_2_ + 1;
      }
    }
    StreamWriter<false,_false>::PutU2(&this->writer,f._6_2_);
    for (f_1._4_4_ = 0; f_1._4_4_ < this_00->mNumFaces; f_1._4_4_ = f_1._4_4_ + 1) {
      paVar3 = this_00->mFaces;
      if (2 < paVar3[f_1._4_4_].mNumIndices) {
        for (chunk_4.chunk_start_pos._4_4_ = 0; chunk_4.chunk_start_pos._4_4_ < 3;
            chunk_4.chunk_start_pos._4_4_ = chunk_4.chunk_start_pos._4_4_ + 1) {
          StreamWriter<false,_false>::PutI2
                    (&this->writer,
                     (int16_t)paVar3[f_1._4_4_].mIndices[chunk_4.chunk_start_pos._4_4_]);
        }
        StreamWriter<false,_false>::PutI2(&this->writer,0);
      }
    }
    WriteFaceMaterialChunk(this,this_00);
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&i_2);
    anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&c,&this->writer,0x4160);
    for (local_15c = 0; local_15c < 4; local_15c = local_15c + 1) {
      for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
        pfVar6 = aiMatrix4x4t<float>::operator[](this_01,local_15c);
        StreamWriter<false,_false>::PutF4(&this->writer,pfVar6[local_160]);
      }
    }
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&c);
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_1.chunk_start_pos);
    std::__cxx11::string::~string((string *)&local_90);
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&name);
    std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator++
              (&local_18);
  }
  return;
}

Assistant:

void Discreet3DSExporter::WriteMeshes()
{
    // NOTE: 3DS allows for instances. However:
    //   i)  not all importers support reading them
    //   ii) instances are not as flexible as they are in assimp, in particular,
    //        nodes can carry (and instance) only one mesh.
    //
    // This exporter currently deep clones all instanced meshes, i.e. for each mesh
    // attached to a node a full TRIMESH chunk is written to the file.
    //
    // Furthermore, the TRIMESH is transformed into world space so that it will
    // appear correctly if importers don't read the scene hierarchy at all.
    for (MeshesByNodeMap::const_iterator it = meshes.begin(); it != meshes.end(); ++it) {
        const aiNode& node = *(*it).first;
        const unsigned int mesh_idx = (*it).second;

        const aiMesh& mesh = *scene->mMeshes[mesh_idx];

        // This should not happen if the SLM step is correctly executed
        // before the scene is handed to the exporter
        ai_assert(mesh.mNumVertices <= 0xffff);
        ai_assert(mesh.mNumFaces <= 0xffff);

        const aiMatrix4x4& trafo = trafos[&node];

        ChunkWriter chunk(writer, Discreet3DS::CHUNK_OBJBLOCK);

        // Mesh name is tied to the node it is attached to so it can later be referenced
        const std::string& name = GetMeshName(mesh, mesh_idx, node);
        WriteString(name);


        // TRIMESH chunk
        ChunkWriter chunk2(writer, Discreet3DS::CHUNK_TRIMESH);

        // Vertices in world space
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_VERTLIST);

            const uint16_t count = static_cast<uint16_t>(mesh.mNumVertices);
            writer.PutU2(count);
            for (unsigned int i = 0; i < mesh.mNumVertices; ++i) {
                const aiVector3D& v = trafo * mesh.mVertices[i];
                writer.PutF4(v.x);
                writer.PutF4(v.y);
                writer.PutF4(v.z);
            }
        }

        // UV coordinates
        if (mesh.HasTextureCoords(0)) {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_MAPLIST);
            const uint16_t count = static_cast<uint16_t>(mesh.mNumVertices);
            writer.PutU2(count);

            for (unsigned int i = 0; i < mesh.mNumVertices; ++i) {
                const aiVector3D& v = mesh.mTextureCoords[0][i];
                writer.PutF4(v.x);
                writer.PutF4(v.y);
            }
        }

        // Faces (indices)
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_FACELIST);

            ai_assert(mesh.mNumFaces <= 0xffff);

            // Count triangles, discard lines and points
            uint16_t count = 0;
            for (unsigned int i = 0; i < mesh.mNumFaces; ++i) {
                const aiFace& f = mesh.mFaces[i];
                if (f.mNumIndices < 3) {
                    continue;
                }
                // TRIANGULATE step is a pre-requisite so we should not see polys here
                ai_assert(f.mNumIndices == 3);
                ++count;
            }

            writer.PutU2(count);
            for (unsigned int i = 0; i < mesh.mNumFaces; ++i) {
                const aiFace& f = mesh.mFaces[i];
                if (f.mNumIndices < 3) {
                    continue;
                }

                for (unsigned int j = 0; j < 3; ++j) {
                    ai_assert(f.mIndices[j] <= 0xffff);
                    writer.PutI2(static_cast<uint16_t>(f.mIndices[j]));
                }

                // Edge visibility flag
                writer.PutI2(0x0);
            }

            // TODO: write smoothing groups (CHUNK_SMOOLIST)

            WriteFaceMaterialChunk(mesh);
        }

        // Transformation matrix by which the mesh vertices have been pre-transformed with.
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRMATRIX);
            for (unsigned int r = 0; r < 4; ++r) {
                for (unsigned int c = 0; c < 3; ++c) {
                    writer.PutF4(trafo[r][c]);
                }
            }
        }
    }
}